

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5PoslistOffsetsCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  u32 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iCol;
  long in_FS_OFFSET;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < nChunk) {
    for (uVar5 = 0; (int)uVar5 < nChunk; uVar5 = uVar5 + iVar2) {
      local_3c = 0xaaaaaaaa;
      iVar2 = sqlite3Fts5GetVarint32(pChunk + uVar5,&local_3c);
      uVar1 = local_3c;
      iVar4 = *(int *)((long)pContext + 0x10);
      iCol = local_3c + iVar4 + -2;
      *(int *)((long)pContext + 0x10) = iCol;
      iVar3 = fts5IndexColsetTest(*(Fts5Colset **)((long)pContext + 8),iCol);
      if (iVar3 != 0) {
        iVar4 = sqlite3Fts5PutVarint
                          ((uchar *)((long)(int)(*pContext)[1] + **pContext),
                           (long)(int)((uVar1 + iVar4) - *(int *)((long)pContext + 0x14)));
        *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + iVar4;
        *(int *)((long)pContext + 0x14) = iCol;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5PoslistOffsetsCallback(
  Fts5Index *pUnused,
  void *pContext,
  const u8 *pChunk, int nChunk
){
  PoslistOffsetsCtx *pCtx = (PoslistOffsetsCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    int i = 0;
    while( i<nChunk ){
      int iVal;
      i += fts5GetVarint32(&pChunk[i], iVal);
      iVal += pCtx->iRead - 2;
      pCtx->iRead = iVal;
      if( fts5IndexColsetTest(pCtx->pColset, iVal) ){
        fts5BufferSafeAppendVarint(pCtx->pBuf, iVal + 2 - pCtx->iWrite);
        pCtx->iWrite = iVal;
      }
    }
  }
}